

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

int __thiscall
google::protobuf::Reflection::GetRepeatedEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  int *piVar4;
  char *description;
  Descriptor *pDVar5;
  Metadata MVar6;
  
  MVar6 = Message::GetMetadata(message);
  if (MVar6.reflection != this) {
    pDVar5 = this->descriptor_;
    MVar6 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar5,MVar6.descriptor,field,"GetRepeatedEnumValue");
  }
  pDVar5 = this->descriptor_;
  if (field->containing_type_ == pDVar5) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"GetRepeatedEnumValue",CPPTYPE_ENUM);
      }
      if ((field->field_0x1 & 8) == 0) {
        piVar4 = GetRepeatedField<int>(this,message,field,index);
        return *piVar4;
      }
      uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      iVar3 = internal::ExtensionSet::GetRepeatedEnum
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                         field->number_,index);
      return iVar3;
    }
    pDVar5 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar5,field,"GetRepeatedEnumValue",description);
}

Assistant:

int Reflection::GetRepeatedEnumValue(const Message& message,
                                     const FieldDescriptor* field,
                                     int index) const {
  USAGE_CHECK_ALL(GetRepeatedEnumValue, REPEATED, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetRepeatedEnum(field->number(), index);
  } else {
    value = GetRepeatedField<int>(message, field, index);
  }
  return value;
}